

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O3

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::CheckConstraint::Deserialize(CheckConstraint *this,Deserializer *deserializer)

{
  int iVar1;
  CheckConstraint *this_00;
  pointer *__ptr;
  ParsedExpression *pPVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  ParsedExpression *local_20;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"expression");
  if ((char)iVar1 == '\0') {
    pPVar2 = (ParsedExpression *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pPVar2 = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&stack0xffffffffffffffe0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pPVar2 = local_20;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (CheckConstraint *)operator_new(0x18);
  local_28._M_head_impl = pPVar2;
  CheckConstraint(this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_28);
  if (local_28._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_Constraint)._vptr_Constraint = (_func_int **)this_00;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> CheckConstraint::Deserialize(Deserializer &deserializer) {
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "expression");
	auto result = duckdb::unique_ptr<CheckConstraint>(new CheckConstraint(std::move(expression)));
	return std::move(result);
}